

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageConfirmable_Timeout_Test::
~CoapTest_CoapMessageConfirmable_Timeout_Test(CoapTest_CoapMessageConfirmable_Timeout_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageConfirmable_Timeout)
{
    Address localhost;
    EXPECT_EQ(localhost.Set("127.0.0.1"), ErrorCode::kNone);

    auto eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    MockEndpoint peer0{eventBase, localhost, 5683};
    MockEndpoint peer1{eventBase, localhost, 5684};
    peer0.SetPeer(&peer1);
    peer1.SetPeer(&peer0);

    Coap coap0{eventBase, peer0};
    Coap coap1{eventBase, peer1};

    EXPECT_EQ(coap1.AddResource({"/hello",
                                 [&coap1](const Request &aRequest) {
                                     EXPECT_TRUE(aRequest.IsRequest());
                                     EXPECT_EQ(aRequest.GetType(), Type::kConfirmable);
                                     EXPECT_EQ(aRequest.GetCode(), Code::kGet);

                                     ContentFormat contentFormat;
                                     EXPECT_EQ(aRequest.GetContentFormat(contentFormat), ErrorCode::kNone);
                                     EXPECT_EQ(contentFormat, ContentFormat::kTextPlain);

                                     std::string uriPath;
                                     EXPECT_EQ(aRequest.GetUriPath(uriPath), ErrorCode::kNone);
                                     EXPECT_EQ(uriPath, "/hello");

                                     EXPECT_EQ(aRequest.GetPayloadAsString(), "hello, CoAP");

                                     Response response{Type::kAcknowledgment, Code::kContent};
                                     EXPECT_EQ(response.SetContentFormat(ContentFormat::kTextPlain), ErrorCode::kNone);
                                     response.Append("Ack...");
                                     EXPECT_EQ(coap1.SendResponse(aRequest, response), ErrorCode::kNone);
                                 }}),
              ErrorCode::kNone);

    Message request{Type::kConfirmable, Code::kGet};
    EXPECT_EQ(request.SetUriPath("/hello"), ErrorCode::kNone);
    EXPECT_EQ(request.SetContentFormat(ContentFormat::kTextPlain), ErrorCode::kNone);
    request.Append("hello, CoAP");

    // Drop the message to trigger timeout
    peer0.SetDropMessage(true);
    coap0.SendRequest(request, [&eventBase](const Response *aResponse, Error aError) {
        EXPECT_EQ(aResponse, nullptr);
        EXPECT_EQ(aError, ErrorCode::kTimeout);

        event_base_loopbreak(eventBase);
    });

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}